

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageInstanceImages::ImageInstanceImages
          (ImageInstanceImages *this,DeviceInterface *vki,VkDevice device,deUint32 queueFamilyIndex,
          VkQueue queue,Allocator *allocator,VkDescriptorType descriptorType,
          VkImageViewType viewType,int numImages,deUint32 baseMipLevel,deUint32 baseArraySlice)

{
  TextureLevelPyramid *this_00;
  VkImage VVar1;
  VkImageView VVar2;
  Handle<(vk::HandleType)13> HVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  VkAllocationCallbacks *pVVar6;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar7;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar8;
  TextureLevelPyramid *dst;
  VkImageLayout layout;
  Move<vk::Handle<(vk::HandleType)13>_> local_c8;
  deUint64 local_a8;
  DeviceInterface *pDStack_a0;
  VkDevice local_98;
  VkAllocationCallbacks *pVStack_90;
  deUint32 local_84;
  Allocator *local_80;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_78;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_70;
  Move<vk::Handle<(vk::HandleType)13>_> *local_68;
  Move<vk::Handle<(vk::HandleType)9>_> *local_60;
  TextureLevelPyramid *local_58;
  Move<vk::Handle<(vk::HandleType)13>_> *local_50;
  Move<vk::Handle<(vk::HandleType)9>_> *local_48;
  TextureLevelPyramid *local_40;
  VkQueue local_38;
  
  this->m_viewType = viewType;
  this->m_baseMipLevel = baseMipLevel;
  this->m_baseArraySlice = baseArraySlice;
  (this->m_imageFormat).order = RGBA;
  (this->m_imageFormat).type = UNORM_INT8;
  this_00 = &this->m_sourceImageA;
  local_84 = queueFamilyIndex;
  local_80 = allocator;
  local_38 = queue;
  tcu::TextureLevelPyramid::TextureLevelPyramid(this_00,&this->m_imageFormat,2);
  local_40 = &this->m_sourceImageB;
  local_58 = this_00;
  tcu::TextureLevelPyramid::TextureLevelPyramid(local_40,&this->m_imageFormat,2);
  dst = local_40;
  local_70 = &this->m_imageMemoryA;
  (this->m_imageMemoryA).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  local_78 = &this->m_imageMemoryB;
  (this->m_imageMemoryB).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  local_60 = &this->m_imageA;
  local_48 = &this->m_imageB;
  local_68 = &this->m_imageViewA;
  local_50 = &this->m_imageViewB;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  populateSourceImage(this,this_00,true);
  createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_c8,vki,device,local_80,descriptorType,
              viewType,local_58,local_70);
  pVVar6 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar5 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar4 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar3.m_internal =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_98 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pVStack_90 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_a8 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pDStack_a0 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar1.m_internal =
       (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (VVar1.m_internal == 0) {
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = pVVar5;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator = pVVar6;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         HVar3.m_internal;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface = pDVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,VVar1)
    ;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = local_98;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator =
         pVStack_90;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_a8;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface =
         pDStack_a0;
    if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                 &local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImage)local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                          m_internal);
    }
  }
  createImageView(&local_c8,(ImageInstanceImages *)vki,(DeviceInterface *)device,
                  (VkDevice)(ulong)viewType,
                  (VkImageViewType)
                  (this->m_sourceImageA).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (TextureLevelPyramid *)
                  (this->m_sourceImageA).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
                  (VkImage)(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                           object.m_internal,this->m_baseMipLevel,this->m_baseArraySlice);
  pVVar6 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar5 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar4 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar3.m_internal =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_98 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pVStack_90 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_a8 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pDStack_a0 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar2.m_internal =
       (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar2.m_internal == 0) {
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = pVVar5;
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVVar6;
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         HVar3.m_internal;
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface = pDVar4
    ;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               VVar2);
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = local_98;
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         pVStack_90;
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = local_a8;
    (local_68->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         pDStack_a0;
    if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  layout = (uint)(descriptorType != VK_DESCRIPTOR_TYPE_STORAGE_IMAGE) * 4 + VK_IMAGE_LAYOUT_GENERAL;
  uploadImage(this,vki,device,local_84,local_38,local_80,
              (VkImage)(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal,layout,local_58);
  if (numImages == 2) {
    populateSourceImage(this,dst,false);
    createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_c8,vki,device,local_80,descriptorType
                ,viewType,dst,local_78);
    pMVar8 = local_48;
    pVVar6 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    pVVar5 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    pDVar4 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    local_98 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    pVStack_90 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    local_a8 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    pDStack_a0 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                 m_deviceIface;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    VVar1.m_internal =
         (local_48->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
    if (VVar1.m_internal == 0) {
      (local_48->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = pVVar5;
      (local_48->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator = pVVar6;
      (local_48->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
           HVar3.m_internal;
      (local_48->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface =
           pDVar4;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 VVar1);
      (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = local_98;
      (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator =
           pVStack_90;
      (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_a8;
      (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface =
           pDStack_a0;
      if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                   &local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                   (VkImage)local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                            m_internal);
      }
    }
    pMVar7 = local_50;
    createImageView(&local_c8,(ImageInstanceImages *)vki,(DeviceInterface *)device,
                    (VkDevice)(ulong)viewType,
                    (VkImageViewType)
                    (this->m_sourceImageB).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (TextureLevelPyramid *)
                    (this->m_sourceImageB).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (VkImage)(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                             object.m_internal,this->m_baseMipLevel,this->m_baseArraySlice);
    pVVar6 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    pVVar5 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    pDVar4 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    local_98 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    pVStack_90 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    local_a8 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    pDStack_a0 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                 m_deviceIface;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    VVar2.m_internal =
         (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
    if (VVar2.m_internal == 0) {
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = pVVar5;
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVVar6;
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
           HVar3.m_internal;
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface = pDVar4
      ;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&(this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
                 ,VVar2);
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = local_98;
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
           pVStack_90;
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = local_a8;
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
           pDStack_a0;
      if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                   (VkImageView)
                   local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal)
        ;
      }
    }
    uploadImage(this,vki,device,local_84,local_38,local_80,
                (VkImage)(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,layout,dst);
  }
  return;
}

Assistant:

ImageInstanceImages::ImageInstanceImages (const vk::DeviceInterface&	vki,
										  vk::VkDevice					device,
										  deUint32						queueFamilyIndex,
										  vk::VkQueue					queue,
										  vk::Allocator&				allocator,
										  vk::VkDescriptorType			descriptorType,
										  vk::VkImageViewType			viewType,
										  int							numImages,
										  deUint32						baseMipLevel,
										  deUint32						baseArraySlice)
	: m_viewType		(viewType)
	, m_baseMipLevel	(baseMipLevel)
	, m_baseArraySlice	(baseArraySlice)
	, m_imageFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)
	, m_sourceImageA	(m_imageFormat, NUM_MIP_LEVELS)
	, m_sourceImageB	(m_imageFormat, NUM_MIP_LEVELS)
	, m_imageMemoryA	(DE_NULL)
	, m_imageMemoryB	(DE_NULL)
	, m_imageA			(vk::Move<vk::VkImage>())
	, m_imageB			(vk::Move<vk::VkImage>())
	, m_imageViewA		(vk::Move<vk::VkImageView>())
	, m_imageViewB		(vk::Move<vk::VkImageView>())
{
	const vk::VkImageLayout	layout	= getImageLayoutForDescriptorType(descriptorType);

	DE_ASSERT(numImages == 1 || numImages == 2);

	populateSourceImage(&m_sourceImageA, true);
	m_imageA = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageA, &m_imageMemoryA);
	m_imageViewA = createImageView(vki, device, viewType, m_sourceImageA, *m_imageA, m_baseMipLevel, m_baseArraySlice);
	uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageA, layout, m_sourceImageA);

	if (numImages == 2)
	{
		populateSourceImage(&m_sourceImageB, false);
		m_imageB = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageB, &m_imageMemoryB);
		m_imageViewB = createImageView(vki, device, viewType, m_sourceImageB, *m_imageB, m_baseMipLevel, m_baseArraySlice);
		uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageB, layout, m_sourceImageB);
	}
}